

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin(nk_context *ctx,nk_window *win,nk_vec2 size,int is_clicked,nk_rect header)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  bool bVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM2_Qa;
  nk_rect in_stack_00000004;
  nk_rect in_stack_00000014;
  nk_hash hash;
  nk_rect body;
  int is_active;
  int is_open;
  nk_window *popup;
  nk_panel_type panel_type;
  nk_flags flags;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  panel_type = (nk_panel_type)((ulong)in_XMM2_Qa >> 0x20);
  flags = (nk_flags)in_XMM0_Qa;
  uVar4 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x3fc8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) == 0)) {
    iVar5 = 0;
  }
  else {
    iVar5 = *(int *)(in_RSI + 0x124);
    *(int *)(in_RSI + 0x124) = iVar5 + 1;
    bVar2 = *(long *)(in_RSI + 0x110) != 0;
    bVar3 = false;
    if ((*(long *)(in_RSI + 0x110) != 0) && (bVar3 = false, *(int *)(in_RSI + 0x11c) == iVar5)) {
      bVar3 = *(int *)(in_RSI + 0x118) == 0x20;
    }
    if (((((in_EDX != 0) && (bVar2)) && (!bVar3)) || ((bVar2 && (!bVar3)))) ||
       ((!bVar2 && ((!bVar3 && (in_EDX == 0)))))) {
      iVar5 = 0;
    }
    else {
      if ((in_EDX != 0) && (bVar2)) {
        nk_rect(0.0,0.0,0.0,0.0);
      }
      iVar1 = nk_nonblock_begin((nk_context *)CONCAT44(in_stack_fffffffffffffffc,uVar4),flags,
                                in_stack_00000014,in_stack_00000004,panel_type);
      if (iVar1 == 0) {
        iVar5 = 0;
      }
      else {
        *(undefined4 *)(in_RSI + 0x118) = 0x20;
        *(int *)(in_RSI + 0x11c) = iVar5;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

NK_INTERN int
nk_combo_begin(struct nk_context *ctx, struct nk_window *win,
    struct nk_vec2 size, int is_clicked, struct nk_rect header)
{
    struct nk_window *popup;
    int is_open = 0;
    int is_active = 0;
    struct nk_rect body;
    nk_hash hash;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    popup = win->popup.win;
    body.x = header.x;
    body.w = size.x;
    body.y = header.y + header.h-ctx->style.window.combo_border;
    body.h = size.y;

    hash = win->popup.combo_count++;
    is_open = (popup) ? nk_true:nk_false;
    is_active = (popup && (win->popup.name == hash) && win->popup.type == NK_PANEL_COMBO);
    if ((is_clicked && is_open && !is_active) || (is_open && !is_active) ||
        (!is_open && !is_active && !is_clicked)) return 0;
    if (!nk_nonblock_begin(ctx, 0, body,
        (is_clicked && is_open)?nk_rect(0,0,0,0):header, NK_PANEL_COMBO)) return 0;

    win->popup.type = NK_PANEL_COMBO;
    win->popup.name = hash;
    return 1;
}